

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

Font * __thiscall sf::Font::operator=(Font *this,Font *right)

{
  Font *in_RDI;
  Font temp;
  map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  *in_stack_ffffffffffffff48;
  void *local_a8;
  void *pvStack_a0;
  Font *in_stack_ffffffffffffff68;
  Font *in_stack_ffffffffffffff70;
  int *piStack_88;
  bool abStack_80 [128];
  
  Font(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::swap<void*>(&in_RDI->m_library,&local_a8);
  std::swap<void*>((void **)&in_RDI->m_face,&pvStack_a0);
  std::swap<void*>(&in_RDI->m_streamRec,(void **)&stack0xffffffffffffff68);
  std::swap<void*>(&in_RDI->m_stroker,(void **)&stack0xffffffffffffff70);
  std::swap<int*>(&in_RDI->m_refCount,&piStack_88);
  std::swap<bool>(&in_RDI->m_isSmooth,abStack_80);
  std::swap<sf::Font::Info>((Info *)in_stack_ffffffffffffff70,(Info *)in_stack_ffffffffffffff68);
  std::
  swap<unsigned_int,sf::Font::Page,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sf::Font::Page>>>
            ((map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
              *)in_RDI,in_stack_ffffffffffffff48);
  std::swap<unsigned_char,std::allocator<unsigned_char>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff48);
  ~Font(in_RDI);
  return in_RDI;
}

Assistant:

Font& Font::operator =(const Font& right)
{
    Font temp(right);

    std::swap(m_library,     temp.m_library);
    std::swap(m_face,        temp.m_face);
    std::swap(m_streamRec,   temp.m_streamRec);
    std::swap(m_stroker,     temp.m_stroker);
    std::swap(m_refCount,    temp.m_refCount);
    std::swap(m_isSmooth,    temp.m_isSmooth);
    std::swap(m_info,        temp.m_info);
    std::swap(m_pages,       temp.m_pages);
    std::swap(m_pixelBuffer, temp.m_pixelBuffer);

    #ifdef SFML_SYSTEM_ANDROID
        std::swap(m_stream, temp.m_stream);
    #endif

    return *this;
}